

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O0

CURLcode Curl_auth_create_digest_http_message
                   (Curl_easy *data,char *userp,char *passwdp,uchar *request,uchar *uripath,
                   digestdata *digest,char **outptr,size_t *outlen)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  CURLcode CVar5;
  int iVar6;
  size_t sVar7;
  uchar *puVar8;
  char *pcVar9;
  undefined8 in_stack_fffffffffffffe78;
  undefined4 uVar11;
  undefined8 uVar10;
  uchar *md5this2;
  char *tmp;
  char *response;
  char *userp_quoted;
  size_t cnonce_sz;
  char *cnonce;
  char cnoncebuf [33];
  uchar local_e8 [8];
  uchar ha2 [33];
  uchar local_b8 [8];
  uchar ha1 [33];
  uchar *md5this;
  uchar request_digest [33];
  uchar local_58 [8];
  uchar md5buf [16];
  CURLcode result;
  digestdata *digest_local;
  uchar *uripath_local;
  uchar *request_local;
  char *passwdp_local;
  char *userp_local;
  Curl_easy *data_local;
  
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  cnonce_sz = 0;
  userp_quoted = (char *)0x0;
  if (digest->nc == 0) {
    digest->nc = 1;
  }
  if (digest->cnonce == (char *)0x0) {
    uVar1 = Curl_rand(data);
    uVar2 = Curl_rand(data);
    uVar3 = Curl_rand(data);
    uVar4 = Curl_rand(data);
    uVar10 = CONCAT44(uVar11,uVar4);
    curl_msnprintf((char *)&cnonce,0x21,"%08x%08x%08x%08x",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
                   uVar10);
    uVar11 = (undefined4)((ulong)uVar10 >> 0x20);
    sVar7 = strlen((char *)&cnonce);
    CVar5 = Curl_base64_encode(data,(char *)&cnonce,sVar7,(char **)&cnonce_sz,
                               (size_t *)&userp_quoted);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    digest->cnonce = (char *)cnonce_sz;
    md5buf[0xc] = '\0';
    md5buf[0xd] = '\0';
    md5buf[0xe] = '\0';
    md5buf[0xf] = '\0';
  }
  register0x00000000 = (uchar *)curl_maprintf("%s:%s:%s",userp,digest->realm,passwdp);
  if (register0x00000000 == (uchar *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    md5buf[0xc] = '\0';
    md5buf[0xd] = '\0';
    md5buf[0xe] = '\0';
    md5buf[0xf] = '\0';
    Curl_md5it(local_58,register0x00000000);
    (*Curl_cfree)(stack0xffffffffffffff70);
    auth_digest_md5_to_ascii(local_58,local_b8);
    if (digest->algo == 1) {
      puVar8 = (uchar *)curl_maprintf("%s:%s:%s",local_b8,digest->nonce,digest->cnonce);
      if (puVar8 == (uchar *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      md5buf[0xc] = '\0';
      md5buf[0xd] = '\0';
      md5buf[0xe] = '\0';
      md5buf[0xf] = '\0';
      Curl_md5it(local_58,puVar8);
      (*Curl_cfree)(puVar8);
      auth_digest_md5_to_ascii(local_58,local_b8);
    }
    register0x00000000 = (uchar *)curl_maprintf("%s:%s",request,uripath);
    if ((digest->qop != (char *)0x0) && (iVar6 = Curl_raw_equal(digest->qop,"auth-int"), iVar6 != 0)
       ) {
      puVar8 = (uchar *)curl_maprintf("%s:%s",stack0xffffffffffffff70,
                                      "d41d8cd98f00b204e9800998ecf8427e");
      (*Curl_cfree)(stack0xffffffffffffff70);
      unique0x10000606 = puVar8;
    }
    if (stack0xffffffffffffff70 == (uchar *)0x0) {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      md5buf[0xc] = '\0';
      md5buf[0xd] = '\0';
      md5buf[0xe] = '\0';
      md5buf[0xf] = '\0';
      Curl_md5it(local_58,stack0xffffffffffffff70);
      (*Curl_cfree)(stack0xffffffffffffff70);
      auth_digest_md5_to_ascii(local_58,local_e8);
      if (digest->qop == (char *)0x0) {
        register0x00000000 = (uchar *)curl_maprintf("%s:%s:%s",local_b8,digest->nonce,local_e8);
      }
      else {
        puVar8 = local_e8;
        register0x00000000 =
             (uchar *)curl_maprintf("%s:%s:%08x:%s:%s:%s",local_b8,digest->nonce,
                                    (ulong)(uint)digest->nc,digest->cnonce,digest->qop,puVar8);
        uVar11 = (undefined4)((ulong)puVar8 >> 0x20);
      }
      if (stack0xffffffffffffff70 == (uchar *)0x0) {
        data_local._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        md5buf[0xc] = '\0';
        md5buf[0xd] = '\0';
        md5buf[0xe] = '\0';
        md5buf[0xf] = '\0';
        Curl_md5it(local_58,stack0xffffffffffffff70);
        (*Curl_cfree)(stack0xffffffffffffff70);
        auth_digest_md5_to_ascii(local_58,(uchar *)&md5this);
        pcVar9 = auth_digest_string_quoted(userp);
        if (pcVar9 == (char *)0x0) {
          data_local._4_4_ = CURLE_OUT_OF_MEMORY;
        }
        else {
          if (digest->qop == (char *)0x0) {
            tmp = curl_maprintf("username=\"%s\", realm=\"%s\", nonce=\"%s\", uri=\"%s\", response=\"%s\""
                                ,pcVar9,digest->realm,digest->nonce,uripath,&md5this);
          }
          else {
            tmp = curl_maprintf("username=\"%s\", realm=\"%s\", nonce=\"%s\", uri=\"%s\", cnonce=\"%s\", nc=%08x, qop=%s, response=\"%s\""
                                ,pcVar9,digest->realm,digest->nonce,uripath,digest->cnonce,
                                CONCAT44(uVar11,digest->nc),digest->qop,&md5this);
            iVar6 = Curl_raw_equal(digest->qop,"auth");
            if (iVar6 != 0) {
              digest->nc = digest->nc + 1;
            }
          }
          (*Curl_cfree)(pcVar9);
          if (tmp == (char *)0x0) {
            data_local._4_4_ = CURLE_OUT_OF_MEMORY;
          }
          else {
            if (digest->opaque != (char *)0x0) {
              pcVar9 = curl_maprintf("%s, opaque=\"%s\"",tmp,digest->opaque);
              (*Curl_cfree)(tmp);
              tmp = pcVar9;
              if (pcVar9 == (char *)0x0) {
                return CURLE_OUT_OF_MEMORY;
              }
            }
            if (digest->algorithm != (char *)0x0) {
              pcVar9 = curl_maprintf("%s, algorithm=\"%s\"",tmp,digest->algorithm);
              (*Curl_cfree)(tmp);
              tmp = pcVar9;
              if (pcVar9 == (char *)0x0) {
                return CURLE_OUT_OF_MEMORY;
              }
            }
            *outptr = tmp;
            sVar7 = strlen(tmp);
            *outlen = sVar7;
            data_local._4_4_ = CURLE_OK;
          }
        }
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_auth_create_digest_http_message(struct Curl_easy *data,
                                              const char *userp,
                                              const char *passwdp,
                                              const unsigned char *request,
                                              const unsigned char *uripath,
                                              struct digestdata *digest,
                                              char **outptr, size_t *outlen)
{
  CURLcode result;
  unsigned char md5buf[16]; /* 16 bytes/128 bits */
  unsigned char request_digest[33];
  unsigned char *md5this;
  unsigned char ha1[33];    /* 32 digits and 1 zero byte */
  unsigned char ha2[33];    /* 32 digits and 1 zero byte */
  char cnoncebuf[33];
  char *cnonce = NULL;
  size_t cnonce_sz = 0;
  char *userp_quoted;
  char *response = NULL;
  char *tmp = NULL;

  if(!digest->nc)
    digest->nc = 1;

  if(!digest->cnonce) {
    snprintf(cnoncebuf, sizeof(cnoncebuf), "%08x%08x%08x%08x",
             Curl_rand(data), Curl_rand(data),
             Curl_rand(data), Curl_rand(data));

    result = Curl_base64_encode(data, cnoncebuf, strlen(cnoncebuf),
                                &cnonce, &cnonce_sz);
    if(result)
      return result;

    digest->cnonce = cnonce;
  }

  /*
    If the algorithm is "MD5" or unspecified (which then defaults to MD5):

      A1 = unq(username-value) ":" unq(realm-value) ":" passwd

    If the algorithm is "MD5-sess" then:

      A1 = H(unq(username-value) ":" unq(realm-value) ":" passwd) ":"
           unq(nonce-value) ":" unq(cnonce-value)
  */

  md5this = (unsigned char *)
    aprintf("%s:%s:%s", userp, digest->realm, passwdp);
  if(!md5this)
    return CURLE_OUT_OF_MEMORY;

  CURL_OUTPUT_DIGEST_CONV(data, md5this); /* convert on non-ASCII machines */
  Curl_md5it(md5buf, md5this);
  free(md5this);
  auth_digest_md5_to_ascii(md5buf, ha1);

  if(digest->algo == CURLDIGESTALGO_MD5SESS) {
    /* nonce and cnonce are OUTSIDE the hash */
    tmp = aprintf("%s:%s:%s", ha1, digest->nonce, digest->cnonce);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;

    CURL_OUTPUT_DIGEST_CONV(data, tmp); /* Convert on non-ASCII machines */
    Curl_md5it(md5buf, (unsigned char *) tmp);
    free(tmp);
    auth_digest_md5_to_ascii(md5buf, ha1);
  }

  /*
    If the "qop" directive's value is "auth" or is unspecified, then A2 is:

      A2 = Method ":" digest-uri-value

    If the "qop" value is "auth-int", then A2 is:

      A2 = Method ":" digest-uri-value ":" H(entity-body)

    (The "Method" value is the HTTP request method as specified in section
    5.1.1 of RFC 2616)
  */

  md5this = (unsigned char *) aprintf("%s:%s", request, uripath);

  if(digest->qop && Curl_raw_equal(digest->qop, "auth-int")) {
    /* We don't support auth-int for PUT or POST at the moment.
       TODO: replace md5 of empty string with entity-body for PUT/POST */
    unsigned char *md5this2 = (unsigned char *)
      aprintf("%s:%s", md5this, "d41d8cd98f00b204e9800998ecf8427e");
    free(md5this);
    md5this = md5this2;
  }

  if(!md5this)
    return CURLE_OUT_OF_MEMORY;

  CURL_OUTPUT_DIGEST_CONV(data, md5this); /* convert on non-ASCII machines */
  Curl_md5it(md5buf, md5this);
  free(md5this);
  auth_digest_md5_to_ascii(md5buf, ha2);

  if(digest->qop) {
    md5this = (unsigned char *) aprintf("%s:%s:%08x:%s:%s:%s",
                                        ha1,
                                        digest->nonce,
                                        digest->nc,
                                        digest->cnonce,
                                        digest->qop,
                                        ha2);
  }
  else {
    md5this = (unsigned char *) aprintf("%s:%s:%s",
                                        ha1,
                                        digest->nonce,
                                        ha2);
  }

  if(!md5this)
    return CURLE_OUT_OF_MEMORY;

  CURL_OUTPUT_DIGEST_CONV(data, md5this); /* convert on non-ASCII machines */
  Curl_md5it(md5buf, md5this);
  free(md5this);
  auth_digest_md5_to_ascii(md5buf, request_digest);

  /* For test case 64 (snooped from a Mozilla 1.3a request)

     Authorization: Digest username="testuser", realm="testrealm", \
     nonce="1053604145", uri="/64", response="c55f7f30d83d774a3d2dcacf725abaca"

     Digest parameters are all quoted strings.  Username which is provided by
     the user will need double quotes and backslashes within it escaped.  For
     the other fields, this shouldn't be an issue.  realm, nonce, and opaque
     are copied as is from the server, escapes and all.  cnonce is generated
     with web-safe characters.  uri is already percent encoded.  nc is 8 hex
     characters.  algorithm and qop with standard values only contain web-safe
     characters.
  */
  userp_quoted = auth_digest_string_quoted(userp);
  if(!userp_quoted)
    return CURLE_OUT_OF_MEMORY;

  if(digest->qop) {
    response = aprintf("username=\"%s\", "
                       "realm=\"%s\", "
                       "nonce=\"%s\", "
                       "uri=\"%s\", "
                       "cnonce=\"%s\", "
                       "nc=%08x, "
                       "qop=%s, "
                       "response=\"%s\"",
                       userp_quoted,
                       digest->realm,
                       digest->nonce,
                       uripath,
                       digest->cnonce,
                       digest->nc,
                       digest->qop,
                       request_digest);

    if(Curl_raw_equal(digest->qop, "auth"))
      digest->nc++; /* The nc (from RFC) has to be a 8 hex digit number 0
                       padded which tells to the server how many times you are
                       using the same nonce in the qop=auth mode */
  }
  else {
    response = aprintf("username=\"%s\", "
                       "realm=\"%s\", "
                       "nonce=\"%s\", "
                       "uri=\"%s\", "
                       "response=\"%s\"",
                       userp_quoted,
                       digest->realm,
                       digest->nonce,
                       uripath,
                       request_digest);
  }
  free(userp_quoted);
  if(!response)
    return CURLE_OUT_OF_MEMORY;

  /* Add the optional fields */
  if(digest->opaque) {
    /* Append the opaque */
    tmp = aprintf("%s, opaque=\"%s\"", response, digest->opaque);
    free(response);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;

    response = tmp;
  }

  if(digest->algorithm) {
    /* Append the algorithm */
    tmp = aprintf("%s, algorithm=\"%s\"", response, digest->algorithm);
    free(response);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;

    response = tmp;
  }

  /* Return the output */
  *outptr = response;
  *outlen = strlen(response);

  return CURLE_OK;
}